

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

bool32 __thiscall rw::Geometry::hasColoredMaterial(Geometry *this)

{
  Material **ppMVar1;
  ulong uVar2;
  ulong uVar3;
  Material *pMVar4;
  bool bVar5;
  
  uVar2 = (ulong)(this->matList).numMaterials;
  if ((long)uVar2 < 1) {
    return 0;
  }
  ppMVar1 = (this->matList).materials;
  pMVar4 = *ppMVar1;
  if ((pMVar4->color).red != 0xff) {
    return 1;
  }
  bVar5 = true;
  uVar3 = 1;
  do {
    if (((((pMVar4->color).green != 0xff) || ((pMVar4->color).blue != 0xff)) ||
        ((pMVar4->color).alpha != 0xff)) || (bVar5 = uVar3 < uVar2, uVar3 == uVar2)) break;
    pMVar4 = ppMVar1[uVar3];
    uVar3 = uVar3 + 1;
  } while ((pMVar4->color).red == 0xff);
  return (uint)bVar5;
}

Assistant:

bool32
Geometry::hasColoredMaterial(void)
{
	for(int32 i = 0; i < this->matList.numMaterials; i++)
		if(this->matList.materials[i]->color.red != 255 ||
		   this->matList.materials[i]->color.green != 255 ||
		   this->matList.materials[i]->color.blue != 255 ||
		   this->matList.materials[i]->color.alpha != 255)
			return 1;
	return 0;
}